

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

int64_t __thiscall spvtools::opt::analysis::Constant::GetSignExtendedValue(Constant *this)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  IntConstant *this_00;
  int64_t iVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    __assert_fail("int_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x7e,"int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
  }
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x24);
  if (uVar1 < 0x41) {
    iVar2 = (*this->_vptr_Constant[0xe])(this);
    this_00 = (IntConstant *)CONCAT44(extraout_var_00,iVar2);
    if (this_00 == (IntConstant *)0x0) {
      iVar2 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_01,iVar2) == 0) {
        __assert_fail("AsNullConstant() && \"Must be an integer constant.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x8b,
                      "int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
      }
      iVar4 = 0;
    }
    else {
      if (0x20 < uVar1) {
        iVar4 = IntConstant::GetS64BitValue(this_00);
        return iVar4;
      }
      iVar3 = IntConstant::GetS32BitValue(this_00);
      iVar4 = (int64_t)iVar3;
    }
    return iVar4;
  }
  __assert_fail("width <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x80,"int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
}

Assistant:

int64_t Constant::GetSignExtendedValue() const {
  const auto* int_type = type()->AsInteger();
  assert(int_type != nullptr);
  const auto width = int_type->width();
  assert(width <= 64);

  int64_t value = 0;
  if (const IntConstant* ic = AsIntConstant()) {
    if (width <= 32) {
      // Let the C++ compiler do the sign extension.
      value = int64_t(ic->GetS32BitValue());
    } else {
      value = ic->GetS64BitValue();
    }
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
  }
  return value;
}